

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O1

ostream * operator<<(ostream *os,
                    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *property)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,*(char **)(property + 0x20),*(long *)(property + 0x28));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,*(char **)property,*(long *)(property + 8));
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::tuple<std::string, std::string> &property) {
  os << std::get<0>(property) << " = " << std::get<1>(property);
  return os;
}